

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O0

void __thiscall TPZMHMixedMeshControl::DeletePressureElements(TPZMHMixedMeshControl *this)

{
  int64_t iVar1;
  TPZCompMesh *pTVar2;
  long in_RDI;
  TPZCompEl *cel;
  int64_t el;
  int64_t nel;
  int64_t in_stack_ffffffffffffffc8;
  TPZCompMesh *in_stack_ffffffffffffffd0;
  TPZGeoMesh *in_stack_ffffffffffffffe0;
  long local_18;
  
  TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
  TPZGeoMesh::ResetReference(in_stack_ffffffffffffffe0);
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x28));
  iVar1 = TPZCompMesh::NElements((TPZCompMesh *)0x1f5d64a);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x28));
    pTVar2 = (TPZCompMesh *)
             TPZCompMesh::Element(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if ((pTVar2 != (TPZCompMesh *)0x0) &&
       (in_stack_ffffffffffffffd0 = pTVar2, pTVar2 != (TPZCompMesh *)0x0)) {
      (**(code **)(*(long *)pTVar2 + 8))();
      in_stack_ffffffffffffffd0 = pTVar2;
    }
  }
  return;
}

Assistant:

void TPZMHMixedMeshControl::DeletePressureElements()
{
    fGMesh->ResetReference();
    int64_t nel = fPressureFineMesh->NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZCompEl *cel = fPressureFineMesh->Element(el);
        if (cel) {
            delete cel;
        }
    }
}